

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O2

void __thiscall helics::BasicHandleInfo::~BasicHandleInfo(BasicHandleInfo *this)

{
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->tags);
  std::__cxx11::string::~string((string *)&this->units);
  std::__cxx11::string::~string((string *)&this->type);
  std::__cxx11::string::~string((string *)&this->key);
  return;
}

Assistant:

BasicHandleInfo() noexcept: type_in(type), type_out(units) {}